

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-c.cpp
# Opt level: O3

bool CanFetchValue(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  byte bVar2;
  
  if (result != (duckdb_result *)0x0) {
    bVar1 = duckdb::DeprecatedMaterializeResult(result);
    if (((bVar1) && (col < result->deprecated_column_count)) && (row < result->deprecated_row_count)
       ) {
      bVar2 = result->deprecated_columns[col].deprecated_nullmask[row] ^ 1;
    }
    else {
      bVar2 = 0;
    }
    return (bool)bVar2;
  }
  return false;
}

Assistant:

bool CanUseDeprecatedFetch(duckdb_result *result, idx_t col, idx_t row) {
	if (!result) {
		return false;
	}
	if (!duckdb::DeprecatedMaterializeResult(result)) {
		return false;
	}
	if (col >= result->deprecated_column_count || row >= result->deprecated_row_count) {
		return false;
	}
	return true;
}